

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32::anon_class_16_2_3fdfa3b0::operator()
          (anon_class_16_2_3fdfa3b0 *this,SVInt *svi)

{
  Preprocessor *this_00;
  optional<int> oVar1;
  ulong uVar2;
  SourceRange range;
  
  this_00 = this->this;
  oVar1 = SVInt::as<int>(svi);
  uVar2 = 0x100000000;
  if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x180000000) != 0x100000000) {
    range = syntax::SyntaxNode::sourceRange(&this->expr->super_SyntaxNode);
    addDiag(this_00,(DiagCode)0x240004,range);
    uVar2 = 0;
  }
  return (optional<unsigned_int>)
         ((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> & 0xffffffff | uVar2);
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}